

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O1

string * flatbuffers::kotlin::KotlinGenerator::CastToSigned_abi_cxx11_(Type type)

{
  string *in_RDI;
  int iStack0000000000000008;
  undefined2 uStack0000000000000020;
  undefined6 uStack_2e;
  
  for (; iStack0000000000000008 == 0xe; _iStack0000000000000008 = _iStack0000000000000008 >> 0x20) {
    _uStack0000000000000020 = CONCAT62(uStack_2e,uStack0000000000000020);
  }
  switch(iStack0000000000000008) {
  case 1:
  case 4:
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    break;
  default:
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    break;
  case 6:
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    break;
  case 8:
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    break;
  case 10:
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  }
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

static std::string CastToSigned(const Type type) {
    switch (type.base_type) {
      case BASE_TYPE_UINT: return ".toInt()";
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_UTYPE: return ".toByte()";
      case BASE_TYPE_USHORT: return ".toShort()";
      case BASE_TYPE_ULONG: return ".toLong()";
      case BASE_TYPE_VECTOR: return CastToSigned(type.VectorType());
      default: return "";
    }
  }